

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

void __thiscall Fl_Widget::deactivate(Fl_Widget *this)

{
  int iVar1;
  Fl_Widget *this_local;
  
  iVar1 = active_r(this);
  if (iVar1 == 0) {
    set_flag(this,1);
  }
  else {
    set_flag(this,1);
    redraw(this);
    redraw_label(this);
    (*this->_vptr_Fl_Widget[3])(this,0xd);
    fl_throw_focus(this);
  }
  return;
}

Assistant:

void Fl_Widget::deactivate() {
  if (active_r()) {
    set_flag(INACTIVE);
    redraw();
    redraw_label();
    handle(FL_DEACTIVATE);
    fl_throw_focus(this);
  } else {
    set_flag(INACTIVE);
  }
}